

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall DirectChainedMap<TypeFunction_*>::rehash(DirectChainedMap<TypeFunction_*> *this)

{
  uint uVar1;
  Node *pNVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  Node *start;
  Node *start_00;
  
  uVar1 = this->bucketCount;
  pNVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  this->count = 0;
  iVar3 = (*this->allocator->_vptr_Allocator[2])();
  this->data = (Node *)CONCAT44(extraout_var,iVar3);
  NULLC::fillMemory((Node *)CONCAT44(extraout_var,iVar3),0,(ulong)this->bucketCount * 0x18);
  start_00 = pNVar2;
  for (uVar4 = (ulong)uVar1; uVar4 != 0; uVar4 = uVar4 - 1) {
    if (*(long *)(start_00 + 0x10) != 0) {
      rehash_insert_reverse(this,start_00,start_00);
    }
    start_00 = start_00 + 0x18;
  }
  (*this->allocator->_vptr_Allocator[3])(this->allocator,pNVar2);
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;
		count = 0;

		data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node *start = &oldData[i];

			if(start->next == NULL)
				continue;

			rehash_insert_reverse(start, start);
		}

		allocator->dealloc(oldData);
	}